

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

bool embree::avx::SphereMiMBIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  uint uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  long lVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  Scene *pSVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  ulong uVar29;
  undefined4 uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar50;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar46 [32];
  float fVar51;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar55;
  undefined1 auVar56 [16];
  float fVar64;
  float fVar65;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar87 [32];
  undefined1 auVar61 [32];
  float fVar66;
  float fVar70;
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar71 [36];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [36];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [28];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [28];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar98 [28];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [28];
  undefined1 auVar102 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<8> hit;
  undefined1 local_360 [16];
  undefined1 (*local_350) [16];
  Scene *local_348;
  Primitive *local_340;
  RayK<4> *local_338;
  RTCFilterFunctionNArguments local_330;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  uint local_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  undefined1 local_250 [16];
  uint local_240;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint uStack_228;
  uint uStack_224;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar82 [64];
  undefined1 auVar97 [64];
  
  pSVar23 = context->scene;
  uVar2 = sphere->sharedGeomID;
  pGVar3 = (pSVar23->geometries).items[uVar2].ptr;
  fVar1 = (pGVar3->time_range).lower;
  fVar1 = pGVar3->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar3->time_range).upper - fVar1));
  auVar56 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar56 = vminss_avx(auVar56,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar56 = vmaxss_avx(ZEXT816(0) << 0x20,auVar56);
  uVar21 = (ulong)(sphere->primIDs).field_0.i[0];
  lVar4 = *(long *)&pGVar3[2].numPrimitives;
  lVar19 = (long)(int)auVar56._0_4_ * 0x38;
  lVar5 = *(long *)(lVar4 + lVar19);
  lVar32 = *(long *)(lVar4 + 0x10 + lVar19);
  uVar25 = (ulong)(sphere->primIDs).field_0.i[1];
  uVar26 = (ulong)(sphere->primIDs).field_0.i[2];
  uVar33 = (ulong)(sphere->primIDs).field_0.i[3];
  uVar22 = (ulong)(sphere->primIDs).field_0.i[4];
  auVar57._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar32 * uVar22);
  auVar57._0_16_ = *(undefined1 (*) [16])(lVar5 + lVar32 * uVar21);
  uVar31 = (ulong)(sphere->primIDs).field_0.i[5];
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar32 * uVar31);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar5 + lVar32 * uVar25);
  uVar27 = (ulong)(sphere->primIDs).field_0.i[6];
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar32 * uVar27);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar5 + lVar32 * uVar26);
  uVar29 = (ulong)(sphere->primIDs).field_0.i[7];
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar32 * uVar29);
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar5 + lVar32 * uVar33);
  lVar5 = *(long *)(lVar4 + 0x38 + lVar19);
  lVar4 = *(long *)(lVar4 + 0x48 + lVar19);
  auVar83._16_16_ = *(undefined1 (*) [16])(lVar5 + uVar22 * lVar4);
  auVar83._0_16_ = *(undefined1 (*) [16])(lVar5 + uVar21 * lVar4);
  lVar32 = uVar31 * lVar4;
  auVar86._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar32);
  auVar86._0_16_ = *(undefined1 (*) [16])(lVar5 + uVar25 * lVar4);
  auVar89._16_16_ = *(undefined1 (*) [16])(lVar5 + uVar27 * lVar4);
  auVar89._0_16_ = *(undefined1 (*) [16])(lVar5 + uVar26 * lVar4);
  auVar92._16_16_ = *(undefined1 (*) [16])(lVar5 + lVar4 * uVar29);
  auVar92._0_16_ = *(undefined1 (*) [16])(lVar5 + uVar33 * lVar4);
  fVar1 = fVar1 - auVar56._0_4_;
  auVar58 = vunpcklps_avx(auVar57,auVar76);
  auVar87 = vunpckhps_avx(auVar57,auVar76);
  auVar59 = vunpcklps_avx(auVar72,auVar78);
  auVar57 = vunpckhps_avx(auVar72,auVar78);
  auVar10 = vunpcklps_avx(auVar58,auVar59);
  auVar58 = vunpckhps_avx(auVar58,auVar59);
  auVar11 = vunpcklps_avx(auVar87,auVar57);
  auVar87 = vunpckhps_avx(auVar87,auVar57);
  auVar103 = vunpcklps_avx(auVar83,auVar89);
  auVar57 = vunpckhps_avx(auVar83,auVar89);
  auVar72 = vunpcklps_avx(auVar86,auVar92);
  auVar59 = vunpckhps_avx(auVar86,auVar92);
  auVar12 = vunpcklps_avx(auVar103,auVar72);
  auVar103 = vunpckhps_avx(auVar103,auVar72);
  auVar13 = vunpcklps_avx(auVar57,auVar59);
  auVar72 = vunpckhps_avx(auVar57,auVar59);
  auVar56 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar44 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar46._8_4_ = 0x3f800000;
  auVar46._0_8_ = 0x3f8000003f800000;
  auVar46._12_4_ = 0x3f800000;
  auVar46._16_4_ = 0x3f800000;
  auVar46._20_4_ = 0x3f800000;
  auVar46._24_4_ = 0x3f800000;
  auVar46._28_4_ = 0x3f800000;
  fVar1 = auVar56._0_4_;
  fVar7 = auVar56._4_4_;
  fVar8 = auVar56._8_4_;
  fVar9 = auVar56._12_4_;
  fVar55 = auVar44._0_4_;
  fVar35 = auVar44._4_4_;
  fVar42 = auVar44._8_4_;
  fVar38 = auVar44._12_4_;
  auVar79._0_4_ = auVar12._0_4_ * fVar1 + fVar55 * auVar10._0_4_;
  auVar79._4_4_ = auVar12._4_4_ * fVar7 + fVar35 * auVar10._4_4_;
  auVar79._8_4_ = auVar12._8_4_ * fVar8 + fVar42 * auVar10._8_4_;
  auVar79._12_4_ = auVar12._12_4_ * fVar9 + fVar38 * auVar10._12_4_;
  auVar79._16_4_ = auVar12._16_4_ * fVar1 + fVar55 * auVar10._16_4_;
  auVar79._20_4_ = auVar12._20_4_ * fVar7 + fVar35 * auVar10._20_4_;
  auVar79._24_4_ = auVar12._24_4_ * fVar8 + fVar42 * auVar10._24_4_;
  auVar79._28_4_ = auVar12._28_4_ + auVar10._28_4_;
  auVar77._0_4_ = fVar55 * auVar58._0_4_ + fVar1 * auVar103._0_4_;
  auVar77._4_4_ = fVar35 * auVar58._4_4_ + fVar7 * auVar103._4_4_;
  auVar77._8_4_ = fVar42 * auVar58._8_4_ + fVar8 * auVar103._8_4_;
  auVar77._12_4_ = fVar38 * auVar58._12_4_ + fVar9 * auVar103._12_4_;
  auVar77._16_4_ = fVar55 * auVar58._16_4_ + fVar1 * auVar103._16_4_;
  auVar77._20_4_ = fVar35 * auVar58._20_4_ + fVar7 * auVar103._20_4_;
  auVar77._24_4_ = fVar42 * auVar58._24_4_ + fVar8 * auVar103._24_4_;
  auVar77._28_4_ = auVar58._28_4_ + auVar103._28_4_;
  auVar84._0_4_ = auVar13._0_4_ * fVar1 + auVar11._0_4_ * fVar55;
  auVar84._4_4_ = auVar13._4_4_ * fVar7 + auVar11._4_4_ * fVar35;
  auVar84._8_4_ = auVar13._8_4_ * fVar8 + auVar11._8_4_ * fVar42;
  auVar84._12_4_ = auVar13._12_4_ * fVar9 + auVar11._12_4_ * fVar38;
  auVar84._16_4_ = auVar13._16_4_ * fVar1 + auVar11._16_4_ * fVar55;
  auVar84._20_4_ = auVar13._20_4_ * fVar7 + auVar11._20_4_ * fVar35;
  auVar84._24_4_ = auVar13._24_4_ * fVar8 + auVar11._24_4_ * fVar42;
  auVar84._28_4_ = auVar13._28_4_ + auVar103._28_4_;
  fVar34 = fVar55 * auVar87._0_4_ + fVar1 * auVar72._0_4_;
  fVar36 = fVar35 * auVar87._4_4_ + fVar7 * auVar72._4_4_;
  fVar37 = fVar42 * auVar87._8_4_ + fVar8 * auVar72._8_4_;
  fVar39 = fVar38 * auVar87._12_4_ + fVar9 * auVar72._12_4_;
  fVar40 = fVar55 * auVar87._16_4_ + fVar1 * auVar72._16_4_;
  fVar41 = fVar35 * auVar87._20_4_ + fVar7 * auVar72._20_4_;
  fVar42 = fVar42 * auVar87._24_4_ + fVar8 * auVar72._24_4_;
  local_210 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
  local_220 = local_210;
  uVar30 = *(undefined4 *)(ray + k * 4);
  auVar58._4_4_ = uVar30;
  auVar58._0_4_ = uVar30;
  auVar58._8_4_ = uVar30;
  auVar58._12_4_ = uVar30;
  auVar58._16_4_ = uVar30;
  auVar58._20_4_ = uVar30;
  auVar58._24_4_ = uVar30;
  auVar58._28_4_ = uVar30;
  auVar57 = vsubps_avx(auVar79,auVar58);
  uVar30 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar59._4_4_ = uVar30;
  auVar59._0_4_ = uVar30;
  auVar59._8_4_ = uVar30;
  auVar59._12_4_ = uVar30;
  auVar59._16_4_ = uVar30;
  auVar59._20_4_ = uVar30;
  auVar59._24_4_ = uVar30;
  auVar59._28_4_ = uVar30;
  auVar58 = vsubps_avx(auVar77,auVar59);
  uVar30 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar60._4_4_ = uVar30;
  auVar60._0_4_ = uVar30;
  auVar60._8_4_ = uVar30;
  auVar60._12_4_ = uVar30;
  auVar60._16_4_ = uVar30;
  auVar60._20_4_ = uVar30;
  auVar60._24_4_ = uVar30;
  auVar60._28_4_ = uVar30;
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar93 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar7 = *(float *)(ray + k * 4 + 0x50);
  auVar95 = ZEXT3264(CONCAT428(fVar7,CONCAT424(fVar7,CONCAT420(fVar7,CONCAT416(fVar7,CONCAT412(fVar7
                                                  ,CONCAT48(fVar7,CONCAT44(fVar7,fVar7))))))));
  fVar8 = *(float *)(ray + k * 4 + 0x60);
  auVar99 = ZEXT3264(CONCAT428(fVar8,CONCAT424(fVar8,CONCAT420(fVar8,CONCAT416(fVar8,CONCAT412(fVar8
                                                  ,CONCAT48(fVar8,CONCAT44(fVar8,fVar8))))))));
  auVar59 = vsubps_avx(auVar84,auVar60);
  auVar56 = ZEXT416((uint)(fVar1 * fVar1 + fVar7 * fVar7 + fVar8 * fVar8));
  auVar56 = vshufps_avx(auVar56,auVar56,0);
  auVar61._16_16_ = auVar56;
  auVar61._0_16_ = auVar56;
  auVar87 = vrcpps_avx(auVar61);
  fVar43 = auVar87._0_4_;
  fVar49 = auVar87._4_4_;
  auVar103._4_4_ = fVar49 * auVar56._4_4_;
  auVar103._0_4_ = fVar43 * auVar56._0_4_;
  fVar50 = auVar87._8_4_;
  auVar103._8_4_ = fVar50 * auVar56._8_4_;
  fVar55 = auVar56._12_4_;
  fVar51 = auVar87._12_4_;
  auVar103._12_4_ = fVar51 * fVar55;
  fVar52 = auVar87._16_4_;
  auVar103._16_4_ = fVar52 * auVar56._0_4_;
  fVar53 = auVar87._20_4_;
  auVar103._20_4_ = fVar53 * auVar56._4_4_;
  fVar54 = auVar87._24_4_;
  auVar103._24_4_ = fVar54 * auVar56._8_4_;
  auVar103._28_4_ = fVar55;
  auVar103 = vsubps_avx(auVar46,auVar103);
  fVar43 = fVar43 + fVar43 * auVar103._0_4_;
  fVar49 = fVar49 + fVar49 * auVar103._4_4_;
  fVar50 = fVar50 + fVar50 * auVar103._8_4_;
  fVar51 = fVar51 + fVar51 * auVar103._12_4_;
  fVar52 = fVar52 + fVar52 * auVar103._16_4_;
  fVar53 = fVar53 + fVar53 * auVar103._20_4_;
  fVar54 = fVar54 + fVar54 * auVar103._24_4_;
  fVar35 = auVar87._28_4_;
  fVar70 = fVar35 + fVar35 + fVar55;
  fVar55 = (fVar1 * auVar57._0_4_ + fVar7 * auVar58._0_4_ + fVar8 * auVar59._0_4_) * fVar43;
  fVar64 = (fVar1 * auVar57._4_4_ + fVar7 * auVar58._4_4_ + fVar8 * auVar59._4_4_) * fVar49;
  auVar11._4_4_ = fVar64;
  auVar11._0_4_ = fVar55;
  fVar65 = (fVar1 * auVar57._8_4_ + fVar7 * auVar58._8_4_ + fVar8 * auVar59._8_4_) * fVar50;
  auVar11._8_4_ = fVar65;
  fVar66 = (fVar1 * auVar57._12_4_ + fVar7 * auVar58._12_4_ + fVar8 * auVar59._12_4_) * fVar51;
  auVar11._12_4_ = fVar66;
  fVar67 = (fVar1 * auVar57._16_4_ + fVar7 * auVar58._16_4_ + fVar8 * auVar59._16_4_) * fVar52;
  auVar11._16_4_ = fVar67;
  fVar68 = (fVar1 * auVar57._20_4_ + fVar7 * auVar58._20_4_ + fVar8 * auVar59._20_4_) * fVar53;
  auVar11._20_4_ = fVar68;
  fVar69 = (fVar1 * auVar57._24_4_ + fVar7 * auVar58._24_4_ + fVar8 * auVar59._24_4_) * fVar54;
  auVar11._24_4_ = fVar69;
  auVar11._28_4_ = fVar70;
  auVar87._4_4_ = fVar1 * fVar64;
  auVar87._0_4_ = fVar1 * fVar55;
  auVar87._8_4_ = fVar1 * fVar65;
  auVar87._12_4_ = fVar1 * fVar66;
  auVar87._16_4_ = fVar1 * fVar67;
  auVar87._20_4_ = fVar1 * fVar68;
  auVar87._24_4_ = fVar1 * fVar69;
  auVar87._28_4_ = fVar35;
  auVar10._4_4_ = fVar7 * fVar64;
  auVar10._0_4_ = fVar7 * fVar55;
  auVar10._8_4_ = fVar7 * fVar65;
  auVar10._12_4_ = fVar7 * fVar66;
  auVar10._16_4_ = fVar7 * fVar67;
  auVar10._20_4_ = fVar7 * fVar68;
  auVar10._24_4_ = fVar7 * fVar69;
  auVar10._28_4_ = fVar9;
  auVar13._4_4_ = fVar8 * fVar64;
  auVar13._0_4_ = fVar8 * fVar55;
  auVar13._8_4_ = fVar8 * fVar65;
  auVar13._12_4_ = fVar8 * fVar66;
  auVar13._16_4_ = fVar8 * fVar67;
  auVar13._20_4_ = fVar8 * fVar68;
  auVar13._24_4_ = fVar8 * fVar69;
  auVar13._28_4_ = auVar12._28_4_;
  auVar103 = vsubps_avx(auVar57,auVar87);
  auVar100 = ZEXT3264(auVar103);
  auVar10 = vsubps_avx(auVar58,auVar10);
  auVar88 = ZEXT3264(auVar10);
  auVar59 = vsubps_avx(auVar59,auVar13);
  auVar90 = ZEXT3264(auVar59);
  auVar73._0_4_ =
       auVar103._0_4_ * auVar103._0_4_ +
       auVar10._0_4_ * auVar10._0_4_ + auVar59._0_4_ * auVar59._0_4_;
  auVar73._4_4_ =
       auVar103._4_4_ * auVar103._4_4_ +
       auVar10._4_4_ * auVar10._4_4_ + auVar59._4_4_ * auVar59._4_4_;
  auVar73._8_4_ =
       auVar103._8_4_ * auVar103._8_4_ +
       auVar10._8_4_ * auVar10._8_4_ + auVar59._8_4_ * auVar59._8_4_;
  auVar73._12_4_ =
       auVar103._12_4_ * auVar103._12_4_ +
       auVar10._12_4_ * auVar10._12_4_ + auVar59._12_4_ * auVar59._12_4_;
  auVar73._16_4_ =
       auVar103._16_4_ * auVar103._16_4_ +
       auVar10._16_4_ * auVar10._16_4_ + auVar59._16_4_ * auVar59._16_4_;
  auVar73._20_4_ =
       auVar103._20_4_ * auVar103._20_4_ +
       auVar10._20_4_ * auVar10._20_4_ + auVar59._20_4_ * auVar59._20_4_;
  auVar73._24_4_ =
       auVar103._24_4_ * auVar103._24_4_ +
       auVar10._24_4_ * auVar10._24_4_ + auVar59._24_4_ * auVar59._24_4_;
  auVar73._28_4_ = auVar58._28_4_ + auVar58._28_4_ + auVar57._28_4_;
  auVar12._4_4_ = fVar36 * fVar36;
  auVar12._0_4_ = fVar34 * fVar34;
  auVar12._8_4_ = fVar37 * fVar37;
  auVar12._12_4_ = fVar39 * fVar39;
  auVar12._16_4_ = fVar40 * fVar40;
  auVar12._20_4_ = fVar41 * fVar41;
  auVar12._24_4_ = fVar42 * fVar42;
  auVar12._28_4_ = fVar38 + auVar72._28_4_;
  auVar87 = vcmpps_avx(auVar73,auVar12,2);
  auVar56 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar80._16_16_ = auVar56;
  auVar80._0_16_ = auVar56;
  auVar57 = vcvtdq2ps_avx(auVar80);
  auVar57 = vcmpps_avx(_DAT_01faff40,auVar57,1);
  auVar58 = auVar57 & auVar87;
  if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar58 >> 0x7f,0) != '\0') ||
        (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar58 >> 0xbf,0) != '\0') ||
      (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar58[0x1f] < '\0') {
    auVar87 = vandps_avx(auVar87,auVar57);
    auVar57 = vsubps_avx(auVar12,auVar73);
    auVar14._4_4_ = fVar49 * auVar57._4_4_;
    auVar14._0_4_ = fVar43 * auVar57._0_4_;
    auVar14._8_4_ = fVar50 * auVar57._8_4_;
    auVar14._12_4_ = fVar51 * auVar57._12_4_;
    auVar14._16_4_ = fVar52 * auVar57._16_4_;
    auVar14._20_4_ = fVar53 * auVar57._20_4_;
    auVar14._24_4_ = fVar54 * auVar57._24_4_;
    auVar14._28_4_ = auVar57._28_4_;
    auVar12 = vsqrtps_avx(auVar14);
    auVar102 = ZEXT3264(auVar12);
    auVar13 = vsubps_avx(auVar11,auVar12);
    auVar96._0_4_ = auVar12._0_4_ + fVar55;
    auVar96._4_4_ = auVar12._4_4_ + fVar64;
    auVar96._8_4_ = auVar12._8_4_ + fVar65;
    auVar96._12_4_ = auVar12._12_4_ + fVar66;
    auVar96._16_4_ = auVar12._16_4_ + fVar67;
    auVar96._20_4_ = auVar12._20_4_ + fVar68;
    auVar96._24_4_ = auVar12._24_4_ + fVar69;
    auVar96._28_4_ = auVar12._28_4_ + fVar70;
    auVar97 = ZEXT3264(auVar96);
    auVar56 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
    auVar47._16_16_ = auVar56;
    auVar47._0_16_ = auVar56;
    auVar57 = vcmpps_avx(auVar47,auVar13,2);
    uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar81._4_4_ = uVar30;
    auVar81._0_4_ = uVar30;
    auVar81._8_4_ = uVar30;
    auVar81._12_4_ = uVar30;
    auVar81._16_4_ = uVar30;
    auVar81._20_4_ = uVar30;
    auVar81._24_4_ = uVar30;
    auVar81._28_4_ = uVar30;
    auVar82 = ZEXT3264(auVar81);
    auVar72 = vcmpps_avx(auVar13,auVar81,2);
    auVar57 = vandps_avx(auVar72,auVar57);
    auVar57 = vandps_avx(auVar57,auVar87);
    auVar104 = ZEXT3264(auVar57);
    auVar58 = vcmpps_avx(auVar47,auVar96,2);
    auVar11 = vcmpps_avx(auVar96,auVar81,2);
    auVar58 = vandps_avx(auVar11,auVar58);
    local_300 = vandps_avx(auVar58,auVar87);
    auVar58 = vorps_avx(auVar57,local_300);
    if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar58 >> 0x7f,0) != '\0') ||
          (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar58 >> 0xbf,0) != '\0') ||
        (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar58[0x1f] < '\0')
    {
      auVar62._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      auVar62._8_4_ = -auVar12._8_4_;
      auVar62._12_4_ = -auVar12._12_4_;
      auVar62._16_4_ = -auVar12._16_4_;
      auVar62._20_4_ = -auVar12._20_4_;
      auVar62._24_4_ = -auVar12._24_4_;
      auVar62._28_4_ = -auVar12._28_4_;
      local_200 = vblendvps_avx(auVar96,auVar13,auVar57);
      auVar57 = vblendvps_avx(auVar12,auVar62,auVar57);
      fVar9 = auVar57._0_4_;
      fVar55 = auVar57._4_4_;
      auVar15._4_4_ = fVar1 * fVar55;
      auVar15._0_4_ = fVar1 * fVar9;
      fVar35 = auVar57._8_4_;
      auVar15._8_4_ = fVar1 * fVar35;
      fVar34 = auVar57._12_4_;
      auVar15._12_4_ = fVar1 * fVar34;
      fVar36 = auVar57._16_4_;
      auVar15._16_4_ = fVar1 * fVar36;
      fVar42 = auVar57._20_4_;
      auVar15._20_4_ = fVar1 * fVar42;
      fVar37 = auVar57._24_4_;
      auVar15._24_4_ = fVar1 * fVar37;
      auVar15._28_4_ = auVar72._28_4_;
      auVar16._4_4_ = fVar7 * fVar55;
      auVar16._0_4_ = fVar7 * fVar9;
      auVar16._8_4_ = fVar7 * fVar35;
      auVar16._12_4_ = fVar7 * fVar34;
      auVar16._16_4_ = fVar7 * fVar36;
      auVar16._20_4_ = fVar7 * fVar42;
      auVar16._24_4_ = fVar7 * fVar37;
      auVar16._28_4_ = auVar87._28_4_;
      auVar17._4_4_ = fVar8 * fVar55;
      auVar17._0_4_ = fVar8 * fVar9;
      auVar17._8_4_ = fVar8 * fVar35;
      auVar17._12_4_ = fVar8 * fVar34;
      auVar17._16_4_ = fVar8 * fVar36;
      auVar17._20_4_ = fVar8 * fVar42;
      auVar17._24_4_ = fVar8 * fVar37;
      auVar17._28_4_ = auVar57._28_4_;
      local_1e0 = vsubps_avx(auVar15,auVar103);
      auVar74 = ZEXT3264(local_1e0);
      local_1c0 = vsubps_avx(auVar16,auVar10);
      local_1a0 = vsubps_avx(auVar17,auVar59);
      auVar63 = ZEXT3264(local_1a0);
      uVar30 = vmovmskps_avx(auVar58);
      uVar33 = CONCAT44((int)((ulong)lVar32 >> 0x20),uVar30);
      pauVar24 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar85 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      local_348 = pSVar23;
      local_340 = sphere;
      local_338 = ray;
      do {
        auVar57 = auVar90._0_32_;
        auVar87 = auVar88._0_32_;
        local_330.hit = (RTCHitN *)local_2b0;
        local_330.valid = (int *)local_360;
        auVar59 = auVar100._0_32_;
        auVar98 = auVar99._0_28_;
        auVar75 = auVar74._28_36_;
        auVar94 = auVar95._0_28_;
        auVar71 = auVar63._28_36_;
        auVar101 = auVar102._0_28_;
        auVar91 = auVar93._0_28_;
        auVar58 = auVar97._0_32_;
        auVar103 = auVar104._0_32_;
        uVar21 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar2 = *(uint *)(local_220 + uVar21 * 4);
        pGVar3 = (pSVar23->geometries).items[uVar2].ptr;
        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar28 = true, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_010e340c;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_200 + uVar21 * 4);
          local_330.context = context->user;
          local_250 = vpshufd_avx(ZEXT416(uVar2),0);
          local_260 = (local_340->primIDs).field_0.i[uVar21];
          local_2b0._4_4_ = *(undefined4 *)(local_1e0 + uVar21 * 4);
          uVar30 = *(undefined4 *)(local_1c0 + uVar21 * 4);
          local_2a0._4_4_ = uVar30;
          local_2a0._0_4_ = uVar30;
          local_2a0._8_4_ = uVar30;
          local_2a0._12_4_ = uVar30;
          auVar74 = ZEXT1664(local_2a0);
          uVar30 = *(undefined4 *)(local_1a0 + uVar21 * 4);
          local_290._4_4_ = uVar30;
          local_290._0_4_ = uVar30;
          local_290._8_4_ = uVar30;
          local_290._12_4_ = uVar30;
          local_2b0._0_4_ = local_2b0._4_4_;
          local_2b0._8_4_ = local_2b0._4_4_;
          local_2b0._12_4_ = local_2b0._4_4_;
          auVar63 = ZEXT464(0) << 0x20;
          local_280 = ZEXT432(0) << 0x20;
          vcmpps_avx(local_280,ZEXT432(0) << 0x20,0xf);
          uStack_23c = (local_330.context)->instID[0];
          local_240 = uStack_23c;
          uStack_238 = uStack_23c;
          uStack_234 = uStack_23c;
          uStack_230 = (local_330.context)->instPrimID[0];
          uStack_22c = uStack_230;
          uStack_228 = uStack_230;
          uStack_224 = uStack_230;
          local_360 = *pauVar24;
          local_330.geometryUserPtr = pGVar3->userPtr;
          local_330.N = 4;
          local_2e0 = auVar82._0_32_;
          local_80 = auVar93._0_32_;
          local_a0 = auVar95._0_32_;
          local_c0 = auVar99._0_32_;
          local_e0 = auVar59;
          local_100 = auVar87;
          local_120 = auVar57;
          local_140 = auVar58;
          local_160 = auVar102._0_32_;
          local_180 = auVar103;
          local_330.ray = (RTCRayN *)ray;
          uStack_25c = local_260;
          uStack_258 = local_260;
          uStack_254 = local_260;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar63 = ZEXT464(0) << 0x20;
            auVar74 = ZEXT1664(local_2a0);
            local_350 = pauVar24;
            (*pGVar3->occlusionFilterN)(&local_330);
            auVar104 = ZEXT3264(local_180);
            auVar102 = ZEXT3264(local_160);
            auVar97 = ZEXT3264(local_140);
            auVar90 = ZEXT3264(local_120);
            auVar88 = ZEXT3264(local_100);
            auVar100 = ZEXT3264(local_e0);
            auVar99 = ZEXT3264(local_c0);
            auVar95 = ZEXT3264(local_a0);
            auVar93 = ZEXT3264(local_80);
            auVar85 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar82 = ZEXT3264(local_2e0);
            pSVar23 = local_348;
            pauVar24 = local_350;
          }
          if (local_360 == (undefined1  [16])0x0) {
            auVar44 = ZEXT816(0);
            auVar56 = vpcmpeqd_avx((undefined1  [16])0x0,auVar44);
            auVar44 = vpcmpeqd_avx(auVar44,auVar44);
            auVar56 = auVar56 ^ auVar44;
          }
          else {
            p_Var6 = context->args->filter;
            auVar44 = ZEXT816(0);
            auVar56 = vpcmpeqd_avx(auVar63._0_16_,auVar63._0_16_);
            auVar63 = ZEXT1664(auVar56);
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              auVar74 = ZEXT1664(auVar74._0_16_);
              (*p_Var6)(&local_330);
              auVar56 = vpcmpeqd_avx(auVar56,auVar56);
              auVar63 = ZEXT1664(auVar56);
              auVar44 = ZEXT816(0) << 0x40;
              auVar104 = ZEXT3264(local_180);
              auVar102 = ZEXT3264(local_160);
              auVar97 = ZEXT3264(local_140);
              auVar90 = ZEXT3264(local_120);
              auVar88 = ZEXT3264(local_100);
              auVar100 = ZEXT3264(local_e0);
              auVar99 = ZEXT3264(local_c0);
              auVar95 = ZEXT3264(local_a0);
              auVar93 = ZEXT3264(local_80);
              auVar85 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar82 = ZEXT3264(local_2e0);
              pSVar23 = local_348;
            }
            auVar44 = vpcmpeqd_avx(local_360,auVar44);
            auVar56 = auVar44 ^ auVar63._0_16_;
            auVar44 = vblendvps_avx(auVar85._0_16_,*(undefined1 (*) [16])(local_330.ray + 0x80),
                                    auVar44);
            *(undefined1 (*) [16])(local_330.ray + 0x80) = auVar44;
          }
          auVar57 = auVar90._0_32_;
          auVar87 = auVar88._0_32_;
          auVar59 = auVar100._0_32_;
          auVar98 = auVar99._0_28_;
          auVar75 = auVar74._28_36_;
          auVar94 = auVar95._0_28_;
          auVar71 = auVar63._28_36_;
          auVar101 = auVar102._0_28_;
          auVar91 = auVar93._0_28_;
          auVar58 = auVar97._0_32_;
          auVar103 = auVar104._0_32_;
          auVar44._8_8_ = 0x100000001;
          auVar44._0_8_ = 0x100000001;
          if ((auVar44 & auVar56) != (undefined1  [16])0x0) {
            auVar82 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            bVar28 = true;
            goto LAB_010e340c;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar82._0_4_;
        }
        auVar57 = auVar90._0_32_;
        auVar87 = auVar88._0_32_;
        auVar59 = auVar100._0_32_;
        auVar98 = auVar99._0_28_;
        auVar75 = auVar74._28_36_;
        auVar94 = auVar95._0_28_;
        auVar71 = auVar63._28_36_;
        auVar101 = auVar102._0_28_;
        auVar91 = auVar93._0_28_;
        auVar58 = auVar97._0_32_;
        auVar103 = auVar104._0_32_;
        uVar33 = uVar33 ^ 1L << (uVar21 & 0x3f);
      } while (uVar33 != 0);
      bVar28 = false;
LAB_010e340c:
      local_350 = pauVar24;
      auVar103 = vandps_avx(auVar103,local_300);
      auVar56 = vshufps_avx(auVar82._0_16_,auVar82._0_16_,0);
      auVar48._16_16_ = auVar56;
      auVar48._0_16_ = auVar56;
      auVar10 = vcmpps_avx(auVar58,auVar48,2);
      auVar72 = auVar103 & auVar10;
      if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar72 >> 0x7f,0) == '\0') &&
            (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar72 >> 0xbf,0) == '\0') &&
          (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar72[0x1f])
      {
        return bVar28;
      }
      auVar103 = vandps_avx(auVar10,auVar103);
      fVar1 = auVar101._0_4_;
      fVar7 = auVar101._4_4_;
      auVar18._4_4_ = auVar91._4_4_ * fVar7;
      auVar18._0_4_ = auVar91._0_4_ * fVar1;
      fVar8 = auVar101._8_4_;
      auVar18._8_4_ = auVar91._8_4_ * fVar8;
      fVar9 = auVar101._12_4_;
      auVar18._12_4_ = auVar91._12_4_ * fVar9;
      fVar55 = auVar101._16_4_;
      auVar18._16_4_ = auVar91._16_4_ * fVar55;
      fVar35 = auVar101._20_4_;
      auVar18._20_4_ = auVar91._20_4_ * fVar35;
      fVar34 = auVar101._24_4_;
      auVar18._24_4_ = auVar91._24_4_ * fVar34;
      auVar18._28_4_ = auVar10._28_4_;
      auVar88._0_4_ = auVar94._0_4_ * fVar1;
      auVar88._4_4_ = auVar94._4_4_ * fVar7;
      auVar88._8_4_ = auVar94._8_4_ * fVar8;
      auVar88._12_4_ = auVar94._12_4_ * fVar9;
      auVar88._16_4_ = auVar94._16_4_ * fVar55;
      auVar88._20_4_ = auVar94._20_4_ * fVar35;
      auVar88._24_4_ = auVar94._24_4_ * fVar34;
      auVar88._28_36_ = auVar71;
      auVar90._0_4_ = auVar98._0_4_ * fVar1;
      auVar90._4_4_ = auVar98._4_4_ * fVar7;
      auVar90._8_4_ = auVar98._8_4_ * fVar8;
      auVar90._12_4_ = auVar98._12_4_ * fVar9;
      auVar90._16_4_ = auVar98._16_4_ * fVar55;
      auVar90._20_4_ = auVar98._20_4_ * fVar35;
      auVar90._24_4_ = auVar98._24_4_ * fVar34;
      auVar90._28_36_ = auVar75;
      local_1e0 = vsubps_avx(auVar18,auVar59);
      local_1c0 = vsubps_avx(auVar88._0_32_,auVar87);
      local_1a0 = vsubps_avx(auVar90._0_32_,auVar57);
      local_200 = auVar58;
      pSVar23 = context->scene;
      uVar30 = vmovmskps_avx(auVar103);
      uVar33 = CONCAT44((int)(uVar33 >> 0x20),uVar30);
      auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar56 = vpcmpeqd_avx(auVar91._0_16_,auVar91._0_16_);
      auVar93 = ZEXT1664(auVar56);
      do {
        local_330.hit = (RTCHitN *)local_2b0;
        local_330.valid = (int *)local_360;
        uVar21 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar2 = *(uint *)(local_220 + uVar21 * 4);
        pGVar3 = (pSVar23->geometries).items[uVar2].ptr;
        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar20 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_010e36f8;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_200 + uVar21 * 4);
          local_330.context = context->user;
          local_250 = vpshufd_avx(ZEXT416(uVar2),0);
          local_260 = (local_340->primIDs).field_0.i[uVar21];
          uVar30 = *(undefined4 *)(local_1e0 + uVar21 * 4);
          local_2b0._4_4_ = uVar30;
          local_2b0._0_4_ = uVar30;
          local_2b0._8_4_ = uVar30;
          local_2b0._12_4_ = uVar30;
          uVar30 = *(undefined4 *)(local_1c0 + uVar21 * 4);
          local_2a0._4_4_ = uVar30;
          local_2a0._0_4_ = uVar30;
          local_2a0._8_4_ = uVar30;
          local_2a0._12_4_ = uVar30;
          uVar30 = *(undefined4 *)(local_1a0 + uVar21 * 4);
          local_290._4_4_ = uVar30;
          local_290._0_4_ = uVar30;
          local_290._8_4_ = uVar30;
          local_290._12_4_ = uVar30;
          local_280 = auVar88._0_32_;
          vcmpps_avx(local_280,local_280,0xf);
          uStack_23c = (local_330.context)->instID[0];
          local_240 = uStack_23c;
          uStack_238 = uStack_23c;
          uStack_234 = uStack_23c;
          uStack_230 = (local_330.context)->instPrimID[0];
          uStack_22c = uStack_230;
          uStack_228 = uStack_230;
          uStack_224 = uStack_230;
          local_360 = *local_350;
          local_330.geometryUserPtr = pGVar3->userPtr;
          local_330.N = 4;
          local_2e0 = auVar82._0_32_;
          local_300._0_8_ = pSVar23;
          local_330.ray = (RTCRayN *)ray;
          uStack_25c = local_260;
          uStack_258 = local_260;
          uStack_254 = local_260;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar56 = auVar93._0_16_;
            (*pGVar3->occlusionFilterN)(&local_330);
            auVar56 = vpcmpeqd_avx(auVar56,auVar56);
            auVar93 = ZEXT1664(auVar56);
            auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar85 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar82 = ZEXT3264(local_2e0);
            ray = local_338;
            pSVar23 = (Scene *)local_300._0_8_;
          }
          auVar56 = auVar93._0_16_;
          if (local_360 == (undefined1  [16])0x0) {
            auVar44 = vpcmpeqd_avx(auVar90._0_16_,(undefined1  [16])0x0);
            auVar56 = auVar56 ^ auVar44;
          }
          else {
            p_Var6 = context->args->filter;
            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var6)(&local_330);
              auVar56 = vpcmpeqd_avx(auVar56,auVar56);
              auVar93 = ZEXT1664(auVar56);
              auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar85 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar82 = ZEXT3264(local_2e0);
              pSVar23 = (Scene *)local_300._0_8_;
            }
            auVar44 = vpcmpeqd_avx(auVar90._0_16_,local_360);
            auVar56 = auVar93._0_16_ ^ auVar44;
            auVar44 = vblendvps_avx(auVar85._0_16_,*(undefined1 (*) [16])(local_330.ray + 0x80),
                                    auVar44);
            *(undefined1 (*) [16])(local_330.ray + 0x80) = auVar44;
          }
          auVar45._8_8_ = 0x100000001;
          auVar45._0_8_ = 0x100000001;
          if ((auVar45 & auVar56) != (undefined1  [16])0x0) {
            bVar20 = 1;
            goto LAB_010e36f8;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar82._0_4_;
        }
        uVar33 = uVar33 ^ 1L << (uVar21 & 0x3f);
        if (uVar33 == 0) {
          bVar20 = 0;
LAB_010e36f8:
          return (bool)(bVar28 | bVar20);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }